

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_LibraryMatchesStart(Mio_Library_t *pLib,int fPinFilter,int fPinPerm,int fPinQuick)

{
  uint uVar1;
  word *pEntry;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Wec_t *p_00;
  Mio_Cell2_t *pMVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  if (pLib->vTtMem != (Vec_Mem_t *)0x0) {
    if (((pLib->fPinFilter == fPinFilter) && (pLib->fPinPerm == fPinPerm)) &&
       (pLib->fPinQuick == fPinQuick)) {
      return;
    }
    if (pLib->vTtMem != (Vec_Mem_t *)0x0) {
      Mio_LibraryMatchesStop(pLib);
    }
  }
  pLib->fPinFilter = fPinFilter;
  pLib->fPinPerm = fPinPerm;
  pLib->fPinQuick = fPinQuick;
  pEntry = (word *)malloc(8);
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = 1;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar7 = 9999;
  while( true ) {
    do {
      uVar6 = uVar7;
      uVar7 = uVar6 + 1;
    } while ((uVar6 & 1) != 0);
    if (uVar7 < 9) break;
    iVar5 = 5;
    while (uVar7 % (iVar5 - 2U) != 0) {
      uVar1 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar7 < uVar1) goto LAB_0040a641;
    }
  }
LAB_0040a641:
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar6) {
    uVar1 = uVar7;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar1;
  piVar3 = (int *)malloc((long)(int)uVar1 << 2);
  pVVar2->pArray = piVar3;
  pVVar2->nSize = uVar7;
  if (piVar3 != (int *)0x0) {
    memset(piVar3,0xff,(long)(int)uVar7 << 2);
  }
  p->vTable = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 10000;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(40000);
  pVVar2->pArray = piVar3;
  p->vNexts = pVVar2;
  *pEntry = 0;
  iVar5 = Vec_MemHashInsert(p,pEntry);
  if (iVar5 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  *pEntry = 0xaaaaaaaaaaaaaaaa;
  iVar5 = Vec_MemHashInsert(p,pEntry);
  if (iVar5 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  free(pEntry);
  pLib->vTtMem = p;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pVVar2 = (Vec_Int_t *)calloc(1000,0x10);
  p_00->pArray = pVVar2;
  pLib->vTt2Match = p_00;
  Vec_WecPushLevel(p_00);
  Vec_WecPushLevel(pLib->vTt2Match);
  if (pLib->vTt2Match->nSize == pLib->vTtMem->nEntries) {
    pMVar4 = Nf_StoDeriveMatches(pLib->vTtMem,pLib->vTt2Match,&pLib->nCells,fPinFilter,fPinPerm,
                                 fPinQuick);
    pLib->pCells = pMVar4;
    return;
  }
  __assert_fail("Vec_WecSize(pLib->vTt2Match) == Vec_MemEntryNum(pLib->vTtMem)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                ,0x6f0,"void Mio_LibraryMatchesStart(Mio_Library_t *, int, int, int)");
}

Assistant:

void Mio_LibraryMatchesStart( Mio_Library_t * pLib, int fPinFilter, int fPinPerm, int fPinQuick )
{
    extern Mio_Cell2_t * Nf_StoDeriveMatches( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, int * pnCells, int fPinFilter, int fPinPerm, int fPinQuick );
    if ( pLib->vTtMem && pLib->fPinFilter == fPinFilter && pLib->fPinPerm == fPinPerm && pLib->fPinQuick == fPinQuick )
        return;
    if ( pLib->vTtMem )
        Mio_LibraryMatchesStop( pLib );
    pLib->fPinFilter = fPinFilter;  // pin filtering
    pLib->fPinPerm   = fPinPerm;    // pin permutation
    pLib->fPinQuick  = fPinQuick;   // pin permutation
    pLib->vTtMem     = Vec_MemAllocForTT( 6, 0 );          
    pLib->vTt2Match  = Vec_WecAlloc( 1000 ); 
    Vec_WecPushLevel( pLib->vTt2Match );
    Vec_WecPushLevel( pLib->vTt2Match );
    assert( Vec_WecSize(pLib->vTt2Match) == Vec_MemEntryNum(pLib->vTtMem) );
    pLib->pCells = Nf_StoDeriveMatches( pLib->vTtMem, pLib->vTt2Match, &pLib->nCells, fPinFilter, fPinPerm, fPinQuick );
}